

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void amrex::Add<amrex::EBCellFlagFab,void>
               (FabArray<amrex::EBCellFlagFab> *dst,FabArray<amrex::EBCellFlagFab> *src,int srccomp,
               int dstcomp,int numcomp,IntVect *nghost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int in_ECX;
  int in_EDX;
  MFIter *in_RDI;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<amrex::EBCellFlag> dstFab;
  Array4<const_amrex::EBCellFlag> srcFab;
  Box *bx;
  MFIter mfi;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffd98;
  int local_258;
  int local_254;
  int local_250;
  undefined4 in_stack_fffffffffffffdb4;
  undefined1 do_tiling_;
  int iVar5;
  FabArrayBase *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  undefined1 local_208 [64];
  undefined1 local_1c8 [68];
  Box local_184;
  Box *local_168;
  MFIter local_160;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_d8;
  int local_d0;
  Box *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  undefined8 local_b0;
  int local_a8;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  Box *local_48;
  undefined4 local_3c;
  Box *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined1 *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  undefined1 *local_8;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffdb4 >> 0x18);
  local_f4 = in_R8D;
  local_f0 = in_ECX;
  local_ec = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdb8,(bool)do_tiling_);
  while (bVar4 = MFIter::isValid(&local_160), bVar4) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (IntVect *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_168 = &local_184;
    bVar4 = Box::ok(local_168);
    if (bVar4) {
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                (in_stack_fffffffffffffd98,in_RDI);
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                (in_stack_fffffffffffffd98,in_RDI);
      local_c8 = local_168;
      local_38 = local_168;
      local_3c = 0;
      iVar1 = (local_168->smallend).vect[0];
      local_48 = local_168;
      local_4c = 1;
      iVar2 = (local_168->smallend).vect[1];
      local_d8 = *(undefined8 *)(local_168->smallend).vect;
      local_58 = local_168;
      local_5c = 2;
      iVar3 = (local_168->smallend).vect[2];
      local_a0 = local_168;
      local_68 = &local_168->bigend;
      local_6c = 0;
      in_stack_fffffffffffffdcc = local_68->vect[0];
      local_78 = &local_168->bigend;
      local_7c = 1;
      in_stack_fffffffffffffdd0 = (local_168->bigend).vect[1];
      local_b0 = *(undefined8 *)local_68->vect;
      local_88 = &local_168->bigend;
      local_8c = 2;
      in_stack_fffffffffffffdd4 = (local_168->bigend).vect[2];
      local_d0 = iVar3;
      local_bc = iVar1;
      iStack_b8 = iVar2;
      local_b4 = iVar3;
      local_a8 = in_stack_fffffffffffffdd4;
      local_98 = in_stack_fffffffffffffdcc;
      iStack_94 = in_stack_fffffffffffffdd0;
      local_90 = in_stack_fffffffffffffdd4;
      for (iVar5 = 0; local_250 = iVar3, iVar5 < local_f4; iVar5 = iVar5 + 1) {
        for (; local_254 = iVar2, local_250 <= in_stack_fffffffffffffdd4; local_250 = local_250 + 1)
        {
          for (; local_258 = iVar1, local_254 <= in_stack_fffffffffffffdd0;
              local_254 = local_254 + 1) {
            for (; local_258 <= in_stack_fffffffffffffdcc; local_258 = local_258 + 1) {
              local_30 = iVar5 + local_ec;
              local_20 = local_1c8;
              local_24 = local_258;
              local_28 = local_254;
              local_2c = local_250;
              local_18 = iVar5 + local_f0;
              local_8 = local_208;
              local_c = local_258;
              local_10 = local_254;
              local_14 = local_250;
              EBCellFlag::operator+=((EBCellFlag *)in_stack_fffffffffffffd98,(EBCellFlag *)in_RDI);
            }
          }
        }
      }
    }
    MFIter::operator++(&local_160);
  }
  MFIter::~MFIter(in_RDI);
  return;
}

Assistant:

void
Add (FabArray<FAB>& dst, FabArray<FAB> const& src, int srccomp, int dstcomp, int numcomp, const IntVect& nghost)
{
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstfa = dst.arrays();
        auto const& srcfa = src.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstfa[box_no](i,j,k,n+dstcomp) += srcfa[box_no](i,j,k,n+srccomp);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok())
            {
                auto const srcFab = src.array(mfi);
                auto       dstFab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dstFab(i,j,k,n+dstcomp) += srcFab(i,j,k,n+srccomp);
                });
            }
        }
    }
}